

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parse::Object::setAttach(Object *this,string *anchor,string *coordN)

{
  bool bVar1;
  Attach *this_00;
  char *pcVar2;
  string *coordN_local;
  string *anchor_local;
  Object *this_local;
  
  if (this->attach == (Attach *)0x0) {
    this_00 = (Attach *)operator_new(0x80);
    memset(this_00,0,0x80);
    Attach::Attach(this_00);
    this->attach = this_00;
  }
  bVar1 = std::operator==(anchor,"left_attach");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&this->attach->left,pcVar2);
  }
  bVar1 = std::operator==(anchor,"right_attach");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&this->attach->right,pcVar2);
  }
  bVar1 = std::operator==(anchor,"top_attach");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)this->attach,pcVar2);
  }
  bVar1 = std::operator==(anchor,"bottom_attach");
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=((string *)&this->attach->bottom,pcVar2);
  }
  return;
}

Assistant:

void setAttach(std::string anchor, std::string coordN) {
                if (attach == NULL) {
                    attach = new Attach();
                }
                if (anchor == "left_attach") {
                    attach->left = (coordN.c_str());
                }
                if (anchor == "right_attach") {
                    attach->right = (coordN.c_str());
                }
                if (anchor == "top_attach") {
                    attach->top = (coordN.c_str());
                }
                if (anchor == "bottom_attach") {
                    attach->bottom = (coordN.c_str());
                }
            }